

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_rank_many(void **param_1)

{
  bool bVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  allocator_type local_b1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expect_ranks;
  Roaring r1;
  unsigned_long local_38 [6];
  
  r1.roaring.high_low_container.size = 0x7b;
  r1.roaring.high_low_container.allocation_size = 9999;
  r1.roaring.high_low_container.containers = (container_s **)0xfffffff70000270f;
  r1.roaring.high_low_container.keys._0_4_ = 0xffffffff;
  __l._M_len = 5;
  __l._M_array = (iterator)&r1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&values,__l,(allocator_type *)local_38);
  roaring::Roaring::Roaring(&r1);
  roaring::Roaring::addMany
            (&r1,(long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2,
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&ranks,(long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)local_38);
  roaring::Roaring::rank_many
            (&r1,values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_38[2] = 2;
  local_38[3] = 3;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[4] = 4;
  __l_00._M_len = 5;
  __l_00._M_array = local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&expect_ranks,__l_00,&local_b1)
  ;
  bVar1 = std::operator==(&ranks,&expect_ranks);
  _assert_true((ulong)bVar1,"ranks == expect_ranks",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3d5);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&expect_ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  roaring::Roaring::~Roaring(&r1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_rank_many) {
    std::vector<uint32_t> values = {123, 9999, 9999, 0xFFFFFFF7, 0xFFFFFFFF};
    Roaring r1;
    r1.addMany(values.size(), values.data());

    std::vector<uint64_t> ranks(values.size());
    r1.rank_many(values.data(), values.data() + values.size(), ranks.data());
    std::vector<uint64_t> expect_ranks{1, 2, 2, 3, 4};
    assert_true(ranks == expect_ranks);
}